

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O3

void __thiscall
Js::DynamicTypeHandler::SetPrototype
          (DynamicTypeHandler *this,DynamicObject *instance,RecyclableObject *newPrototype)

{
  Type *addr;
  Type *pTVar1;
  
  DynamicObject::SetTypeHandler(instance,this,true);
  pTVar1 = (instance->super_RecyclableObject).type.ptr;
  addr = &pTVar1->prototype;
  Memory::Recycler::WBSetBit((char *)addr);
  (pTVar1->prototype).ptr = newPrototype;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

void DynamicTypeHandler::SetPrototype(DynamicObject* instance, RecyclableObject* newPrototype)
    {
        // Force a type transition on the instance to invalidate its inline caches
        DynamicTypeHandler::ResetTypeHandler(instance);

        // Put new prototype in place
        instance->GetDynamicType()->SetPrototype(newPrototype);
    }